

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

double __thiscall TerminalOutput::log(TerminalOutput *this,double __x)

{
  undefined1 *puVar1;
  int iVar2;
  FILE *__stream;
  int iVar3;
  int in_ECX;
  undefined8 *puVar4;
  char *in_RDX;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar5;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_40;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_38;
  
  local_38 = (anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1)in_RSI->mValue;
  if ((local_38.mValue & 8U) == 0) {
    puVar4 = (undefined8 *)&stderr;
  }
  else {
    puVar4 = (undefined8 *)&stdout;
  }
  __stream = (FILE *)*puVar4;
  iVar3 = *(int *)&(this->super_LogOutput).field_0x1c;
  if ((local_38.mValue & 4U) == 0) {
    if (iVar3 != 0) {
      fputc(10,__stream);
    }
    *(undefined4 *)&(this->super_LogOutput).field_0x1c = 0;
    local_40.mValue = *(int64_t *)in_RSI;
    writeLog((FILE *)__stream,in_RDX,in_ECX,(Flags<LogOutput::LogFlag> *)&local_40);
    dVar5 = extraout_XMM0_Qa;
    if (((ulong)(this->mFlags).field_0 & 0x20) != 0) {
      fflush(__stream);
      return extraout_XMM0_Qa_00;
    }
  }
  else {
    if (iVar3 != 0) {
      iVar3 = 0xd;
      do {
        fputc(iVar3,__stream);
        puVar1 = &(this->super_LogOutput).field_0x1c;
        iVar2 = *(int *)puVar1;
        *(int *)puVar1 = *(int *)puVar1 + -1;
        iVar3 = 0x20;
      } while (iVar2 != 0);
      fputc(0xd,__stream);
      local_38.mValue = *(int64_t *)in_RSI;
    }
    iVar3 = writeLog((FILE *)__stream,in_RDX,in_ECX,(Flags<LogOutput::LogFlag> *)&local_38);
    *(int *)&(this->super_LogOutput).field_0x1c = iVar3;
    dVar5 = extraout_XMM0_Qa_01;
  }
  return dVar5;
}

Assistant:

virtual void log(Flags<LogOutput::LogFlag> flags, const char *msg, int len) override
    {
        FILE *f = flags & StdOut ? stdout : stderr;
        if (flags & Replaceable) {
            if (mReplaceableLength) {
                fwrite("\r", 1, 1, f);
                while (mReplaceableLength--)
                    fwrite(" ", 1, 1, f);
                fwrite("\r", 1, 1, f);
            }
            mReplaceableLength = writeLog(f, msg, len, flags);
        } else {
            if (mReplaceableLength)
                fwrite("\n", 1, 1, f);
            mReplaceableLength = 0;
            writeLog(f, msg, len, flags);
            if (mFlags & ::LogFlush) {
                fflush(f);
            }
        }
    }